

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

void __thiscall
CLI::App::_parse_subcommand
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  size_t sVar2;
  pointer pAVar3;
  HorribleError *this_00;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  pointer local_98;
  __normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_> local_90;
  pointer local_88;
  __normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_> local_80;
  __normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_> local_78;
  __normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_> local_70 [3]
  ;
  string local_58;
  reference local_38;
  App_p *com;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  App *this_local;
  
  sVar2 = _count_remaining_positionals(this,true);
  if (sVar2 == 0) {
    __end2 = std::
             vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ::begin(&this->subcommands_);
    com = (App_p *)std::
                   vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                   ::end(&this->subcommands_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                                       *)&com), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                 ::operator*(&__end2);
      pAVar3 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(local_38);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(args);
      ::std::__cxx11::string::string((string *)&local_58,(string *)pvVar4);
      bVar1 = check_name(pAVar3,&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(args);
        local_78._M_current =
             (App **)::std::begin<std::vector<CLI::App*,std::allocator<CLI::App*>>>
                               (&this->parsed_subcommands_);
        local_80._M_current =
             (App **)::std::end<std::vector<CLI::App*,std::allocator<CLI::App*>>>
                               (&this->parsed_subcommands_);
        local_88 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::get(local_38);
        local_70[0] = ::std::
                      find<__gnu_cxx::__normal_iterator<CLI::App**,std::vector<CLI::App*,std::allocator<CLI::App*>>>,CLI::App*>
                                (local_78,local_80,&local_88);
        local_90._M_current =
             (App **)::std::end<std::vector<CLI::App*,std::allocator<CLI::App*>>>
                               (&this->parsed_subcommands_);
        bVar1 = __gnu_cxx::operator==(local_70,&local_90);
        if (bVar1) {
          local_98 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::get(local_38);
          std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                    (&this->parsed_subcommands_,&local_98);
        }
        pAVar3 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(local_38);
        _parse(pAVar3,args);
        return;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
      ::operator++(&__end2);
    }
    if (this->parent_ == (App *)0x0) {
      this_00 = (HorribleError *)__cxa_allocate_exception(0x38);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(args);
      ::std::operator+(&local_d8,"Subcommand ",pvVar4);
      ::std::operator+(&local_b8,&local_d8," missing");
      HorribleError::HorribleError(this_00,&local_b8);
      __cxa_throw(this_00,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
    _parse_subcommand(this->parent_,args);
  }
  else {
    _parse_positional(this,args);
  }
  return;
}

Assistant:

void _parse_subcommand(std::vector<std::string> &args) {
        if(_count_remaining_positionals(/* required */ true) > 0)
            return _parse_positional(args);
        for(const App_p &com : subcommands_) {
            if(com->check_name(args.back())) {
                args.pop_back();
                if(std::find(std::begin(parsed_subcommands_), std::end(parsed_subcommands_), com.get()) ==
                   std::end(parsed_subcommands_))
                    parsed_subcommands_.push_back(com.get());
                com->_parse(args);
                return;
            }
        }
        if(parent_ != nullptr)
            return parent_->_parse_subcommand(args);
        else
            throw HorribleError("Subcommand " + args.back() + " missing");
    }